

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O3

void threadFunc(void)

{
  int v;
  Logger local_ff8;
  
  v = 0;
  do {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/tests/LoggingTest.cpp"
                   ,0x10);
    LogStream::operator<<((LogStream *)&local_ff8,v);
    Logger::~Logger(&local_ff8);
    v = v + 1;
  } while (v != 100000);
  return;
}

Assistant:

void threadFunc()
{
    for (int i = 0; i < 100000; ++i)
    {
        LOG << i;
    }
}